

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

float __thiscall lrit::ImageNavigationHeader::getLongitude(ImageNavigationHeader *this)

{
  long in_RDI;
  size_type rpos;
  size_type lpos;
  string name;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  string *in_stack_ffffffffffffff90;
  string local_68 [36];
  undefined4 local_44;
  long local_40;
  long local_38;
  string local_30 [44];
  float local_4;
  
  std::__cxx11::string::string(local_30,(string *)(in_RDI + 8));
  local_38 = std::__cxx11::string::find((char)local_30,0x28);
  local_40 = std::__cxx11::string::find((char)local_30,0x29);
  if ((local_38 == -1) || (local_40 == -1)) {
    local_4 = 0.0;
  }
  else {
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_30);
    local_4 = std::__cxx11::stof(in_stack_ffffffffffffff90,
                                 (size_t *)
                                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::__cxx11::string::~string(local_68);
  }
  local_44 = 1;
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

float ImageNavigationHeader::getLongitude() const {
  auto name = std::string(projectionName);
  auto lpos = name.find('(');
  auto rpos = name.find(')');
  if (lpos == std::string::npos || rpos == std::string::npos) {
    return 0.0;
  }
  return std::stof(name.substr(lpos + 1, rpos - (lpos + 1)));
}